

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::BuildFieldOrExtension
          (DescriptorBuilder *this,FieldDescriptorProto *proto,Descriptor *parent,
          FieldDescriptor *result,bool is_extension)

{
  int iVar1;
  Tables *pTVar2;
  double dVar3;
  Symbol symbol;
  __type _Var4;
  bool bVar5;
  uint uVar6;
  undefined4 uVar7;
  Descriptor *pDVar8;
  string *psVar9;
  string *psVar10;
  long lVar11;
  FieldDescriptor FVar12;
  FieldDescriptor *pFVar13;
  FieldOptions *orig_options;
  int i;
  ulong uVar14;
  SubstituteArg *in_stack_fffffffffffffd78;
  string result_1;
  char *end_pos;
  int local_230;
  Descriptor *local_208;
  string local_200;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  FieldDescriptor *pFStack_1d8;
  string lowercase_name;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  pDVar8 = parent;
  if (parent == (Descriptor *)0x0) {
    pDVar8 = (Descriptor *)this->file_;
  }
  psVar9 = DescriptorPool::Tables::AllocateString(this->tables_,*(string **)(pDVar8 + 8));
  if (psVar9->_M_string_length != 0) {
    std::__cxx11::string::append((ulong)psVar9,'\x01');
  }
  std::__cxx11::string::append((string *)psVar9);
  ValidateSymbolName(this,proto->name_,psVar9,&proto->super_Message);
  psVar10 = DescriptorPool::Tables::AllocateString(this->tables_,proto->name_);
  *(string **)result = psVar10;
  *(string **)(result + 8) = psVar9;
  *(FileDescriptor **)(result + 0x20) = this->file_;
  *(int32 *)(result + 0x28) = proto->number_;
  result[0x34] = (FieldDescriptor)is_extension;
  std::__cxx11::string::string((string *)&lowercase_name,(string *)proto->name_);
  LowerString(&lowercase_name);
  _Var4 = std::operator==(&lowercase_name,proto->name_);
  if (_Var4) {
    psVar9 = *(string **)result;
  }
  else {
    psVar9 = DescriptorPool::Tables::AllocateString(this->tables_,&lowercase_name);
  }
  *(string **)(result + 0x10) = psVar9;
  pTVar2 = this->tables_;
  psVar9 = proto->name_;
  result_1._M_dataplus._M_p = (pointer)&result_1.field_2;
  result_1._M_string_length = 0;
  result_1.field_2._M_local_buf[0] = '\0';
  local_208 = parent;
  std::__cxx11::string::reserve((ulong)&result_1);
  for (uVar14 = 0; uVar14 < psVar9->_M_string_length; uVar14 = uVar14 + 1) {
    if ((psVar9->_M_dataplus)._M_p[uVar14] != '_') {
      std::__cxx11::string::push_back((char)&result_1);
    }
  }
  if ((result_1._M_string_length != 0) && ((byte)(*result_1._M_dataplus._M_p + 0xbfU) < 0x1a)) {
    *result_1._M_dataplus._M_p = *result_1._M_dataplus._M_p | 0x20;
  }
  psVar9 = DescriptorPool::Tables::AllocateString(pTVar2,&result_1);
  *(string **)(result + 0x18) = psVar9;
  std::__cxx11::string::~string((string *)&result_1);
  *(int *)(result + 0x2c) = proto->type_;
  iVar1 = proto->label_;
  *(int *)(result + 0x30) = iVar1;
  *(undefined8 *)(result + 0x38) = 0;
  *(undefined8 *)(result + 0x40) = 0;
  *(undefined8 *)(result + 0x48) = 0;
  *(undefined8 *)(result + 0x50) = 0;
  *(undefined8 *)(result + 0x58) = 0;
  uVar6 = proto->_has_bits_[0];
  FVar12 = SUB41((uVar6 & 0x40) >> 6,0);
  result[0x68] = FVar12;
  if ((iVar1 == 3 & (byte)FVar12) == 1) {
    psVar9 = *(string **)(result + 8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result_1,"Repeated fields can\'t have default values.",
               (allocator<char> *)&end_pos);
    AddError(this,psVar9,&proto->super_Message,DEFAULT_VALUE,&result_1);
    std::__cxx11::string::~string((string *)&result_1);
    uVar6 = proto->_has_bits_[0];
  }
  if ((uVar6 & 8) == 0) goto switchD_001e44b7_default;
  if ((uVar6 & 0x40) == 0) {
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(result + 0x2c) * 4)
          ) {
    case 1:
    case 3:
    case 6:
      *(undefined4 *)(result + 0x70) = 0;
      break;
    case 2:
    case 4:
    case 5:
    case 8:
      *(undefined8 *)(result + 0x70) = 0;
      break;
    case 7:
      result[0x70] = (FieldDescriptor)0x0;
      break;
    case 9:
      *(undefined1 **)(result + 0x70) = (anonymous_namespace)::kEmptyString_abi_cxx11_;
    }
    goto switchD_001e44b7_default;
  }
  end_pos = (char *)0x0;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(result + 0x2c) * 4))
  {
  case 1:
    lVar11 = strtol((proto->default_value_->_M_dataplus)._M_p,&end_pos,0);
    uVar7 = (undefined4)lVar11;
    goto LAB_001e4815;
  case 2:
    psVar9 = (string *)strtoll((proto->default_value_->_M_dataplus)._M_p,&end_pos,0);
    goto LAB_001e4968;
  case 3:
    uVar14 = strtoul((proto->default_value_->_M_dataplus)._M_p,&end_pos,0);
    uVar7 = (undefined4)uVar14;
LAB_001e4815:
    *(undefined4 *)(result + 0x70) = uVar7;
    break;
  case 4:
    psVar9 = (string *)strtoull((proto->default_value_->_M_dataplus)._M_p,&end_pos,0);
    goto LAB_001e4968;
  case 5:
    bVar5 = std::operator==(proto->default_value_,"inf");
    if (bVar5) {
      psVar9 = (string *)0x7ff0000000000000;
    }
    else {
      bVar5 = std::operator==(proto->default_value_,"-inf");
      if (bVar5) {
        psVar9 = (string *)0xfff0000000000000;
      }
      else {
        bVar5 = std::operator==(proto->default_value_,"nan");
        if (!bVar5) {
          dVar3 = NoLocaleStrtod((proto->default_value_->_M_dataplus)._M_p,&end_pos);
          *(double *)(result + 0x70) = dVar3;
          break;
        }
        psVar9 = (string *)0x7ff8000000000000;
      }
    }
LAB_001e4968:
    *(string **)(result + 0x70) = psVar9;
    break;
  case 6:
    bVar5 = std::operator==(proto->default_value_,"inf");
    if (bVar5) {
      *(undefined4 *)(result + 0x70) = 0x7f800000;
    }
    else {
      bVar5 = std::operator==(proto->default_value_,"-inf");
      if (bVar5) {
        *(undefined4 *)(result + 0x70) = 0xff800000;
      }
      else {
        bVar5 = std::operator==(proto->default_value_,"nan");
        if (bVar5) {
          *(undefined4 *)(result + 0x70) = 0x7fc00000;
        }
        else {
          dVar3 = NoLocaleStrtod((proto->default_value_->_M_dataplus)._M_p,&end_pos);
          *(float *)(result + 0x70) = (float)dVar3;
        }
      }
    }
    break;
  case 7:
    bVar5 = std::operator==(proto->default_value_,"true");
    if (bVar5) {
      result[0x70] = (FieldDescriptor)0x1;
    }
    else {
      bVar5 = std::operator==(proto->default_value_,"false");
      if (!bVar5) {
        psVar9 = *(string **)(result + 8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&result_1,"Boolean default must be true or false.",
                   (allocator<char> *)&local_1b0);
        AddError(this,psVar9,&proto->super_Message,DEFAULT_VALUE,&result_1);
        goto LAB_001e4a28;
      }
      result[0x70] = (FieldDescriptor)0x0;
    }
    break;
  case 8:
    *(undefined8 *)(result + 0x70) = 0;
    break;
  case 9:
    pTVar2 = this->tables_;
    if (*(uint *)(result + 0x2c) != 0xc) {
      psVar9 = DescriptorPool::Tables::AllocateString(pTVar2,proto->default_value_);
      goto LAB_001e4968;
    }
    UnescapeCEscapeString(&result_1,proto->default_value_);
    psVar9 = DescriptorPool::Tables::AllocateString(pTVar2,&result_1);
    *(string **)(result + 0x70) = psVar9;
LAB_001e4a28:
    std::__cxx11::string::~string((string *)&result_1);
    break;
  case 10:
    psVar9 = *(string **)(result + 8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result_1,"Messages can\'t have default values.",
               (allocator<char> *)&local_1b0);
    AddError(this,psVar9,&proto->super_Message,DEFAULT_VALUE,&result_1);
    std::__cxx11::string::~string((string *)&result_1);
    result[0x68] = (FieldDescriptor)0x0;
    break;
  default:
    goto switchD_001e44b7_default;
  }
  if ((end_pos != (char *)0x0) &&
     ((proto->default_value_->_M_string_length == 0 || (*end_pos != '\0')))) {
    psVar9 = *(string **)(result + 8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result_1,"Couldn\'t parse default value.",(allocator<char> *)&local_1b0);
    AddError(this,psVar9,&proto->super_Message,DEFAULT_VALUE,&result_1);
    std::__cxx11::string::~string((string *)&result_1);
  }
switchD_001e44b7_default:
  uVar6 = *(uint *)(result + 0x28);
  if ((int)uVar6 < 1) {
    psVar9 = *(string **)(result + 8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result_1,"Field numbers must be positive integers.",
               (allocator<char> *)&end_pos);
    AddError(this,psVar9,&proto->super_Message,NUMBER,&result_1);
    psVar9 = &result_1;
LAB_001e44fa:
    std::__cxx11::string::~string((string *)psVar9);
LAB_001e44ff:
    uVar6 = proto->_has_bits_[0];
    if (!is_extension) goto LAB_001e464f;
    pFVar13 = result + 0x40;
    if ((uVar6 & 0x20) != 0) goto LAB_001e4693;
    psVar9 = *(string **)(result + 8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result_1,"FieldDescriptorProto.extendee not set for extension field.",
               (allocator<char> *)&end_pos);
    AddError(this,psVar9,&proto->super_Message,EXTENDEE,&result_1);
  }
  else {
    if (uVar6 < 0x20000000 || is_extension) {
      if (uVar6 - 19000 < 1000) {
        psVar9 = *(string **)(result + 8);
        strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&result_1,19000);
        strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&end_pos,19999);
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        local_60.text_ = (char *)0x0;
        local_60.size_ = -1;
        local_90.text_ = (char *)0x0;
        local_90.size_ = -1;
        local_c0.text_ = (char *)0x0;
        local_c0.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_200,
                   (strings *)
                   "Field numbers $0 through $1 are reserved for the protocol buffer library implementation."
                   ,(char *)&result_1,(SubstituteArg *)&end_pos,&local_1b0,&local_60,&local_90,
                   &local_c0,&local_f0,&local_120,&local_150,&local_180,in_stack_fffffffffffffd78);
        AddError(this,psVar9,&proto->super_Message,NUMBER,&local_200);
        psVar9 = &local_200;
        goto LAB_001e44fa;
      }
      goto LAB_001e44ff;
    }
    psVar9 = *(string **)(result + 8);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&result_1,0x1fffffff);
    end_pos = (char *)0x0;
    local_230 = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_200,(strings *)"Field numbers cannot be greater than $0.",(char *)&result_1,
               (SubstituteArg *)&end_pos,&local_1b0,&local_60,&local_90,&local_c0,&local_f0,
               &local_120,&local_150,&local_180,in_stack_fffffffffffffd78);
    AddError(this,psVar9,&proto->super_Message,NUMBER,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    uVar6 = proto->_has_bits_[0];
LAB_001e464f:
    pFVar13 = result + 0x38;
    if ((uVar6 & 0x20) == 0) goto LAB_001e4693;
    psVar9 = *(string **)(result + 8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result_1,"FieldDescriptorProto.extendee set for non-extension field.",
               (allocator<char> *)&end_pos);
    AddError(this,psVar9,&proto->super_Message,EXTENDEE,&result_1);
  }
  std::__cxx11::string::~string((string *)&result_1);
LAB_001e4693:
  pDVar8 = local_208;
  *(Descriptor **)pFVar13 = local_208;
  if ((proto->_has_bits_[0] & 0x80) == 0) {
    *(undefined8 *)(result + 0x60) = 0;
  }
  else {
    orig_options = proto->options_;
    if (orig_options == (FieldOptions *)0x0) {
      orig_options = *(FieldOptions **)(FieldDescriptorProto::default_instance_ + 0x38);
    }
    AllocateOptions<google::protobuf::FieldDescriptor>(this,orig_options,result);
  }
  local_1e0 = 2;
  symbol._4_4_ = uStack_1dc;
  symbol.type = 2;
  symbol.field_1.field_descriptor = result;
  pFStack_1d8 = result;
  AddSymbol(this,*(string **)(result + 8),pDVar8,*(string **)result,&proto->super_Message,symbol);
  std::__cxx11::string::~string((string *)&lowercase_name);
  return;
}

Assistant:

void DescriptorBuilder::BuildFieldOrExtension(const FieldDescriptorProto& proto,
                                              const Descriptor* parent,
                                              FieldDescriptor* result,
                                              bool is_extension) {
  const string& scope = (parent == NULL) ?
    file_->package() : parent->full_name();
  string* full_name = tables_->AllocateString(scope);
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_         = tables_->AllocateString(proto.name());
  result->full_name_    = full_name;
  result->file_         = file_;
  result->number_       = proto.number();
  result->is_extension_ = is_extension;

  // If .proto files follow the style guide then the name should already be
  // lower-cased.  If that's the case we can just reuse the string we already
  // allocated rather than allocate a new one.
  string lowercase_name(proto.name());
  LowerString(&lowercase_name);
  if (lowercase_name == proto.name()) {
    result->lowercase_name_ = result->name_;
  } else {
    result->lowercase_name_ = tables_->AllocateString(lowercase_name);
  }

  // Don't bother with the above optimization for camel-case names since
  // .proto files that follow the guide shouldn't be using names in this
  // format, so the optimization wouldn't help much.
  result->camelcase_name_ = tables_->AllocateString(ToCamelCase(proto.name()));

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  result->type_  = static_cast<FieldDescriptor::Type>(
                     implicit_cast<int>(proto.type()));
  result->label_ = static_cast<FieldDescriptor::Label>(
                     implicit_cast<int>(proto.label()));

  // Some of these may be filled in when cross-linking.
  result->containing_type_ = NULL;
  result->extension_scope_ = NULL;
  result->experimental_map_key_ = NULL;
  result->message_type_ = NULL;
  result->enum_type_ = NULL;

  result->has_default_value_ = proto.has_default_value();
  if (proto.has_default_value() && result->is_repeated()) {
    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Repeated fields can't have default values.");
  }

  if (proto.has_type()) {
    if (proto.has_default_value()) {
      char* end_pos = NULL;
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_ =
            strtol(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_ =
            strto64(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_ =
            strtoul(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_ =
            strtou64(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          if (proto.default_value() == "inf") {
            result->default_value_float_ = numeric_limits<float>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_float_ = -numeric_limits<float>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_float_ = numeric_limits<float>::quiet_NaN();
          } else  {
            result->default_value_float_ =
              NoLocaleStrtod(proto.default_value().c_str(), &end_pos);
          }
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          if (proto.default_value() == "inf") {
            result->default_value_double_ = numeric_limits<double>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_double_ = -numeric_limits<double>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_double_ = numeric_limits<double>::quiet_NaN();
          } else  {
            result->default_value_double_ =
              NoLocaleStrtod(proto.default_value().c_str(), &end_pos);
          }
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          if (proto.default_value() == "true") {
            result->default_value_bool_ = true;
          } else if (proto.default_value() == "false") {
            result->default_value_bool_ = false;
          } else {
            AddError(result->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                     "Boolean default must be true or false.");
          }
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = NULL;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          if (result->type() == FieldDescriptor::TYPE_BYTES) {
            result->default_value_string_ = tables_->AllocateString(
              UnescapeCEscapeString(proto.default_value()));
          } else {
            result->default_value_string_ =
                tables_->AllocateString(proto.default_value());
          }
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Messages can't have default values.");
          result->has_default_value_ = false;
          break;
      }

      if (end_pos != NULL) {
        // end_pos is only set non-NULL by the parsers for numeric types, above.
        // This checks that the default was non-empty and had no extra junk
        // after the end of the number.
        if (proto.default_value().empty() || *end_pos != '\0') {
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Couldn't parse default value.");
        }
      }
    } else {
      // No explicit default value
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          result->default_value_float_ = 0.0f;
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          result->default_value_double_ = 0.0;
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          result->default_value_bool_ = false;
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = NULL;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          result->default_value_string_ = &kEmptyString;
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          break;
      }
    }
  }

  if (result->number() <= 0) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Field numbers must be positive integers.");
  } else if (!is_extension && result->number() > FieldDescriptor::kMaxNumber) {
    // Only validate that the number is within the valid field range if it is
    // not an extension. Since extension numbers are validated with the
    // extendee's valid set of extension numbers, and those are in turn
    // validated against the max allowed number, the check is unnecessary for
    // extension fields.
    // This avoids cross-linking issues that arise when attempting to check if
    // the extendee is a message_set_wire_format message, which has a higher max
    // on extension numbers.
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             strings::Substitute("Field numbers cannot be greater than $0.",
                                 FieldDescriptor::kMaxNumber));
  } else if (result->number() >= FieldDescriptor::kFirstReservedNumber &&
             result->number() <= FieldDescriptor::kLastReservedNumber) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             strings::Substitute(
               "Field numbers $0 through $1 are reserved for the protocol "
               "buffer library implementation.",
               FieldDescriptor::kFirstReservedNumber,
               FieldDescriptor::kLastReservedNumber));
  }

  if (is_extension) {
    if (!proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee not set for extension field.");
    }

    result->extension_scope_ = parent;
  } else {
    if (proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee set for non-extension field.");
    }

    result->containing_type_ = parent;
  }

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));
}